

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

void __thiscall
pugi::impl::anon_unknown_0::xml_buffered_writer::flush
          (xml_buffered_writer *this,char_t *data,size_t size)

{
  anon_union_8192_4_fbc60714_for_scratch *paVar1;
  char_t *pcVar2;
  byte bVar3;
  xml_encoding xVar4;
  _func_int *UNRECOVERED_JUMPTABLE;
  long lVar5;
  anon_union_8192_4_fbc60714_for_scratch *paVar6;
  uint uVar7;
  long lVar8;
  uint uVar9;
  byte bVar10;
  
  if (size == 0) {
    return;
  }
  xVar4 = this->encoding;
  if (xVar4 == encoding_utf8) {
    UNRECOVERED_JUMPTABLE = this->writer->_vptr_xml_writer[2];
    (*UNRECOVERED_JUMPTABLE)(this->writer,data,size,UNRECOVERED_JUMPTABLE);
    return;
  }
  paVar1 = &this->scratch;
  if ((xVar4 & ~encoding_utf8) == encoding_utf16_le) {
    lVar8 = 0x800;
    do {
      bVar3 = (byte)*(uint *)data;
      if ((char)bVar3 < '\0') {
        uVar9 = (uint)bVar3;
        if (((size == 1) || ((uVar9 & 0xffffffe0) != 0xc0)) ||
           ((*(byte *)((long)data + 1) & 0xc0) != 0x80)) {
          if (((size < 3) || ((uVar9 & 0xfffffff0) != 0xe0)) ||
             (((*(byte *)((long)data + 1) & 0xffc0) != 0x80 ||
              ((*(byte *)((long)data + 2) & 0xc0) != 0x80)))) {
            if (((size < 4) || ((uVar9 & 0xfffffff8) != 0xf0)) ||
               (((*(byte *)((long)data + 1) & 0xffffffc0) != 0x80 ||
                (((*(byte *)((long)data + 2) & 0xc0) != 0x80 ||
                 (bVar3 = *(byte *)((long)data + 3), (bVar3 & 0xc0) != 0x80)))))) {
              data = (char_t *)((long)data + 1);
              size = size - 1;
            }
            else {
              uVar7 = (uint)*(byte *)((long)data + 2) << 6;
              *(short *)(this->buffer + lVar8) =
                   (short)((uVar7 & 0xc00) +
                           ((*(byte *)((long)data + 1) & 0x3f) << 0xc | (uVar9 & 7) << 0x12) +
                           0x3ff0000 >> 10) + -0x2800;
              *(ushort *)(this->buffer + lVar8 + 2) = bVar3 & 0x3f | (ushort)uVar7 & 0x3ff | 0xdc00;
              lVar8 = lVar8 + 4;
              data = (char_t *)((long)data + 4);
              size = size - 4;
            }
          }
          else {
            *(ushort *)(this->buffer + lVar8) =
                 *(byte *)((long)data + 2) & 0x3f |
                 (*(byte *)((long)data + 1) & 0x3f) << 6 | (ushort)bVar3 << 0xc;
            lVar8 = lVar8 + 2;
            data = (char_t *)((long)data + 3);
            size = size - 3;
          }
        }
        else {
          *(ushort *)(this->buffer + lVar8) =
               *(byte *)((long)data + 1) & 0x3f | (ushort)((uVar9 & 0x1f) << 6);
          lVar8 = lVar8 + 2;
          data = (char_t *)((long)data + 2);
          size = size - 2;
        }
      }
      else {
        *(ushort *)(this->buffer + lVar8) = (ushort)bVar3;
        lVar8 = lVar8 + 2;
        data = (char_t *)((long)data + 1);
        size = size - 1;
        if ((3 < size) && (((ulong)data & 3) == 0)) {
          do {
            if ((*(uint *)data & 0x80808080) != 0) break;
            *(ushort *)(this->buffer + lVar8) = (ushort)*(uint *)data & 0x7f;
            *(ushort *)(this->buffer + lVar8 + 2) = (ushort)*(byte *)((long)data + 1);
            *(ushort *)(this->buffer + lVar8 + 4) = (ushort)*(byte *)((long)data + 2);
            *(ushort *)(this->buffer + lVar8 + 6) = (ushort)*(byte *)((long)data + 3);
            lVar8 = lVar8 + 8;
            data = (char_t *)((long)data + 4);
            size = size - 4;
          } while (3 < size);
        }
      }
    } while (size != 0);
    paVar6 = (anon_union_8192_4_fbc60714_for_scratch *)(this->buffer + lVar8);
    if (lVar8 != 0x800 && xVar4 != encoding_utf16_le) {
      lVar5 = 0x800;
      do {
        pcVar2 = this->buffer + lVar5;
        *(ushort *)pcVar2 = *(ushort *)pcVar2 << 8 | *(ushort *)pcVar2 >> 8;
        lVar5 = lVar5 + 2;
      } while (lVar8 != lVar5);
    }
  }
  else if (xVar4 - encoding_utf32_le < 2) {
    lVar8 = 0x800;
    do {
      uVar9 = (uint)(byte)*(uint *)data;
      if ((char)(byte)*(uint *)data < '\0') {
        if (((size == 1) || ((uVar9 & 0xffffffe0) != 0xc0)) ||
           ((*(byte *)((long)data + 1) & 0xffffffc0) != 0x80)) {
          if ((((size < 3) || ((uVar9 & 0xfffffff0) != 0xe0)) ||
              ((*(byte *)((long)data + 1) & 0xffffffc0) != 0x80)) ||
             ((*(byte *)((long)data + 2) & 0xc0) != 0x80)) {
            if (((size < 4) || ((uVar9 & 0xfffffff8) != 0xf0)) ||
               (((*(byte *)((long)data + 1) & 0xffffffc0) != 0x80 ||
                (((*(byte *)((long)data + 2) & 0xc0) != 0x80 ||
                 ((*(byte *)((long)data + 3) & 0xffffffc0) != 0x80)))))) {
              data = (char_t *)((long)data + 1);
              size = size - 1;
            }
            else {
              *(uint *)(this->buffer + lVar8) =
                   *(byte *)((long)data + 3) & 0x3f |
                   (*(byte *)((long)data + 2) & 0x3f) << 6 |
                   (*(byte *)((long)data + 1) & 0x3f) << 0xc | (uVar9 & 7) << 0x12;
              lVar8 = lVar8 + 4;
              data = (char_t *)((long)data + 4);
              size = size - 4;
            }
          }
          else {
            *(uint *)(this->buffer + lVar8) =
                 *(byte *)((long)data + 2) & 0x3f |
                 (*(byte *)((long)data + 1) & 0x3f) << 6 | (uVar9 & 0xf) << 0xc;
            lVar8 = lVar8 + 4;
            data = (char_t *)((long)data + 3);
            size = size - 3;
          }
        }
        else {
          *(uint *)(this->buffer + lVar8) = *(byte *)((long)data + 1) & 0x3f | (uVar9 & 0x1f) << 6;
          lVar8 = lVar8 + 4;
          data = (char_t *)((long)data + 2);
          size = size - 2;
        }
      }
      else {
        *(uint *)(this->buffer + lVar8) = uVar9;
        lVar8 = lVar8 + 4;
        data = (char_t *)((long)data + 1);
        size = size - 1;
        if ((3 < size) && (((ulong)data & 3) == 0)) {
          do {
            if ((*(uint *)data & 0x80808080) != 0) break;
            *(uint *)(this->buffer + lVar8) = *(uint *)data & 0x7f;
            *(uint *)(this->buffer + lVar8 + 4) = (uint)*(byte *)((long)data + 1);
            *(uint *)(this->buffer + lVar8 + 8) = (uint)*(byte *)((long)data + 2);
            *(uint *)(this->buffer + lVar8 + 0xc) = (uint)*(byte *)((long)data + 3);
            lVar8 = lVar8 + 0x10;
            data = (char_t *)((long)data + 4);
            size = size - 4;
          } while (3 < size);
        }
      }
    } while (size != 0);
    paVar6 = (anon_union_8192_4_fbc60714_for_scratch *)(this->buffer + lVar8);
    if (lVar8 != 0x800 && xVar4 != encoding_utf32_le) {
      lVar5 = 0x800;
      do {
        uVar9 = *(uint *)(this->buffer + lVar5);
        *(uint *)(this->buffer + lVar5) =
             uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18;
        lVar5 = lVar5 + 4;
      } while (lVar8 != lVar5);
    }
  }
  else {
    paVar6 = paVar1;
    if (xVar4 != encoding_latin1) {
      __assert_fail("false && \"Invalid encoding\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/external/pugixml/pugixml.cpp"
                    ,0xe78,
                    "size_t pugi::impl::(anonymous namespace)::convert_buffer_output(char_t *, uint8_t *, uint16_t *, uint32_t *, const char_t *, size_t, xml_encoding)"
                   );
    }
    do {
      bVar3 = (byte)*(uint *)data;
      if ((char)bVar3 < '\0') {
        if ((((size < 3) || ((bVar3 & 0xf0) != 0xe0)) ||
            ((*(byte *)((long)data + 1) & 0xc0) != 0x80)) ||
           ((*(byte *)((long)data + 2) & 0xc0) != 0x80)) {
          data = (char_t *)((long)data + 1);
          size = size - 1;
        }
        else {
          uVar9 = (uint)*(byte *)((long)data + 1) << 6;
          bVar10 = *(byte *)((long)data + 2) & 0x3f | (byte)uVar9;
          if ((uVar9 & 0xf00) != 0 || (bVar3 & 0xf) != 0) {
            bVar10 = 0x3f;
          }
          paVar6->data_u8[0] = bVar10;
          paVar6 = (anon_union_8192_4_fbc60714_for_scratch *)((long)paVar6 + 1);
          data = (char_t *)((long)data + 3);
          size = size - 3;
        }
      }
      else {
        paVar6->data_u8[0] = bVar3;
        paVar6 = (anon_union_8192_4_fbc60714_for_scratch *)(paVar6->data_u8 + 1);
        data = (char_t *)((long)data + 1);
        size = size - 1;
        if ((3 < size) && (((ulong)data & 3) == 0)) {
          do {
            if ((*(uint *)data & 0x80808080) != 0) break;
            paVar6->data_u8[0] = (byte)*(uint *)data;
            paVar6->data_u8[1] = *(byte *)((long)data + 1);
            paVar6->data_u8[2] = *(byte *)((long)data + 2);
            paVar6->data_u8[3] = *(byte *)((long)data + 3);
            paVar6 = (anon_union_8192_4_fbc60714_for_scratch *)(paVar6->data_u8 + 4);
            data = (char_t *)((long)data + 4);
            size = size - 4;
          } while (3 < size);
        }
      }
    } while (size != 0);
  }
  if ((ulong)((long)paVar6 - (long)paVar1->data_u8) < 0x2001) {
    (*this->writer->_vptr_xml_writer[2])(this->writer,paVar1,(long)paVar6 - (long)paVar1->data_u8);
    return;
  }
  __assert_fail("result <= sizeof(scratch)",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/external/pugixml/pugixml.cpp"
                ,0xe9a,
                "void pugi::impl::(anonymous namespace)::xml_buffered_writer::flush(const char_t *, size_t)"
               );
}

Assistant:

void flush(const char_t* data, size_t size)
		{
			if (size == 0) return;

			// fast path, just write data
			if (encoding == get_write_native_encoding())
				writer.write(data, size * sizeof(char_t));
			else
			{
				// convert chunk
				size_t result = convert_buffer_output(scratch.data_char, scratch.data_u8, scratch.data_u16, scratch.data_u32, data, size, encoding);
				assert(result <= sizeof(scratch));

				// write data
				writer.write(scratch.data_u8, result);
			}
		}